

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  WriteMode mode;
  char *pcVar4;
  void *__child_stack;
  void *__arg;
  char **this_00;
  bool bVar5;
  StringPtr name;
  Fault f;
  Own<const_kj::Directory,_std::nullptr_t> local_48;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  
  bVar1 = (this->super_Replacer<kj::Directory>).field_0xc;
  lock.mutex._0_1_ = bVar1 ^ 1;
  if (bVar1 == 0) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&lock,
               &((this->directory).ptr)->impl);
    sVar2 = (this->name).content.size_;
    if (sVar2 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->name).content.ptr;
    }
    mode = (int)sVar2 + (uint)(sVar2 == 0);
    __arg = (void *)(ulong)(this->super_Replacer<kj::Directory>).mode;
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)lock.ptr;
    Impl::openEntry((Impl *)&f,name,mode);
    bVar5 = f.exception != (Exception *)0x0;
    if (bVar5) {
      Directory::clone((Directory *)&local_48,(__fn *)(this->inner).ptr,__child_stack,mode,__arg);
      this_00 = &(f.exception)->file;
      f.exception = (Exception *)local_48.disposer;
      local_48.ptr = (Directory *)0x0;
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::
      init<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                  *)this_00,(DirectoryNode *)&f);
      Own<const_kj::Directory,_std::nullptr_t>::dispose
                ((Own<const_kj::Directory,_std::nullptr_t> *)&f);
      Own<const_kj::Directory,_std::nullptr_t>::dispose(&local_48);
      lVar3 = (*(code *)**(undefined8 **)(lock.ptr)->clock)();
      ((lock.ptr)->lastModified).value.value = lVar3;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[24]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x5d3,FAILED,"!committed","_kjCondition,\"commit() already called\"",
               (DebugExpression<bool> *)&lock,(char (*) [24])"commit() already called");
    _::Debug::Fault::~Fault(&f);
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry.set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }